

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataVariable.h
# Opt level: O2

void __thiscall Rml::FuncDefinition::~FuncDefinition(FuncDefinition *this)

{
  ~FuncDefinition(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

class RMLUICORE_API FuncDefinition final : public VariableDefinition {
public:
	FuncDefinition(DataGetFunc get, DataSetFunc set);

	bool Get(void* ptr, Variant& variant) override;
	bool Set(void* ptr, const Variant& variant) override;

private:
	DataGetFunc get;
	DataSetFunc set;
}